

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O3

bool __thiscall Wasm::WasmSignature::IsEquivalent<true>(WasmSignature *this,WasmSignature *sig)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  bool bVar7;
  
  if (this->m_shortSig == 0xffffffffffffffff) {
    uVar2 = this->m_resultsCount;
    if ((((uVar2 == sig->m_resultsCount) &&
         (uVar1 = this->m_paramsCount, uVar1 == sig->m_paramsCount)) &&
        (this->m_paramSize == sig->m_paramSize)) &&
       ((uVar1 == 0 ||
        (iVar5 = bcmp((this->m_params).ptr,(sig->m_params).ptr,(ulong)uVar1 << 2), iVar5 == 0)))) {
      if ((ulong)uVar2 == 0) {
        bVar4 = true;
      }
      else {
        iVar5 = bcmp((this->m_results).ptr,(sig->m_results).ptr,(ulong)uVar2 << 2);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  bVar7 = sig->m_shortSig == this->m_shortSig;
  bVar4 = IsEquivalent<false>(this,sig);
  if (bVar4 == bVar7) {
    return bVar7;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                     ,0x70,"(this->IsEquivalent<false>(sig) == isEquivalent)",
                     "this->IsEquivalent<false>(sig) == isEquivalent");
  if (bVar4) {
    *puVar6 = 0;
    return bVar7;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

bool WasmSignature::IsEquivalent(const WasmSignature* sig) const
{
    if (useShortSig && m_shortSig != Js::Constants::InvalidSignature)
    {
        bool isEquivalent = sig->GetShortSig() == m_shortSig;
        Assert(this->IsEquivalent<false>(sig) == isEquivalent);
        return isEquivalent;
    }
    if (GetResultCount() == sig->GetResultCount() &&
        GetParamCount() == sig->GetParamCount() &&
        GetParamsSize() == sig->GetParamsSize())
    {
        return (
            (GetParamCount() == 0 || memcmp(m_params, sig->m_params, GetParamCount() * sizeof(Local)) == 0) &&
            (GetResultCount() == 0 || memcmp(m_results, sig->m_results, GetResultCount() * sizeof(Local)) == 0)
        );
    }
    return false;
}